

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho_corasick_test.cpp
# Opt level: O0

void occurence(int i,int index)

{
  bool bVar1;
  size_type sVar2;
  char *message;
  char *in_R9;
  pair<int,_int> local_78;
  string local_70;
  AssertHelper local_50;
  Message local_48 [3];
  pair<int,_int> local_2c;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  int index_local;
  int i_local;
  
  gtest_ar_.message_.ptr_._0_4_ = index;
  gtest_ar_.message_.ptr_._4_4_ = i;
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            (&local_2c,(int *)((long)&gtest_ar_.message_.ptr_ + 4),(int *)&gtest_ar_.message_);
  sVar2 = std::
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          ::count(&se,&local_2c);
  local_21 = sVar2 == 0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_20,(AssertionResult *)"se.count({i, index})","true",
               "false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/strings/aho_corasick_test.cpp"
               ,0x10,message);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            (&local_78,(int *)((long)&gtest_ar_.message_.ptr_ + 4),(int *)&gtest_ar_.message_);
  std::
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>::
  insert(&se,&local_78);
  return;
}

Assistant:

void occurence(int i, int index) {
	EXPECT_FALSE(se.count({i, index}));
	se.insert({i, index});
}